

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O2

void __thiscall
Utf8Decode_LonelyStartCharacters_Test::TestBody(Utf8Decode_LonelyStartCharacters_Test *this)

{
  bytes *input;
  bytes *input_00;
  bytes *input_01;
  uint8_t v;
  uchar uVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  uchar local_ab [2];
  allocator_type local_a9;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  cpstring local_90;
  cpstring local_70;
  cpstring local_50;
  
  for (uVar1 = 0xc0; uVar1 != 0xe0; uVar1 = uVar1 + '\x01') {
    local_ab[1] = 0x20;
    __l._M_len = 2;
    __l._M_array = local_ab;
    local_ab[0] = uVar1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,__l,&local_a9);
    (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_50,&local_a8,input);
    std::__cxx11::u32string::~u32string((u32string *)&local_50);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  }
  for (uVar1 = 0xe0; uVar1 != 0xf0; uVar1 = uVar1 + '\x01') {
    local_ab[1] = 0x20;
    __l_00._M_len = 2;
    __l_00._M_array = local_ab;
    local_ab[0] = uVar1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,__l_00,&local_a9);
    (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_70,&local_a8,input_00);
    std::__cxx11::u32string::~u32string((u32string *)&local_70);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  }
  for (uVar1 = 0xf0; uVar1 != 0xf8; uVar1 = uVar1 + '\x01') {
    local_ab[1] = 0x20;
    __l_01._M_len = 2;
    __l_01._M_array = local_ab;
    local_ab[0] = uVar1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,__l_01,&local_a9);
    (anonymous_namespace)::Utf8Decode::decode_bad_abi_cxx11_(&local_90,&local_a8,input_01);
    std::__cxx11::u32string::~u32string((u32string *)&local_90);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
  }
  return;
}

Assistant:

TEST_F (Utf8Decode, LonelyStartCharacters) {
    // All 32 first bytes of 2-byte sequences (0xC0-0xDF), each followed by a space character.
    for (std::uint8_t v = 0xC0; v <= 0xDF; ++v) {
        decode_bad (bytes ({v, 0x20}));
    }
    // All 16 first bytes of 3-byte sequences (0xE0-0xEF), each followed by a space character.
    for (std::uint8_t v = 0xE0; v <= 0xEF; ++v) {
        decode_bad (bytes ({v, 0x20}));
    }
    // All 8 first bytes of 4-byte sequences (0xF0-0xF7), each followed by a space character.
    for (std::uint8_t v = 0xF0; v <= 0xF7; ++v) {
        decode_bad (bytes ({v, 0x20}));
    }
}